

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractanimation.cpp
# Opt level: O0

void __thiscall QUnifiedTimer::installAnimationDriver(QUnifiedTimer *this,QAnimationDriver *d)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool running;
  QUnifiedTimer *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  QUnifiedTimer *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  QObject *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x10) == in_RDI + 0x18) {
    bVar2 = QAnimationDriver::isRunning((QAnimationDriver *)0x669466);
    if (bVar2) {
      stopAnimationDriver(in_stack_ffffffffffffff78);
    }
    *(undefined8 *)(in_RDI + 0x10) = in_RSI;
    if (*(long *)(in_RDI + 0x10) != 0) {
      QObject::property(in_stack_ffffffffffffff98,in_stack_ffffffffffffffc8);
      bVar3 = ::QVariant::toBool((QVariant *)
                                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      *(bool *)(in_RDI + 0x66) = bVar3;
      ::QVariant::~QVariant
                ((QVariant *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
    if (bVar2) {
      startAnimationDriver(in_stack_ffffffffffffff68);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
               (char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
               (char *)in_stack_ffffffffffffff68);
    QMessageLogger::warning
              ((QMessageLogger *)&stack0xffffffffffffffb8,
               "QUnifiedTimer: animation driver already installed...");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QUnifiedTimer::installAnimationDriver(QAnimationDriver *d)
{
    if (driver != &defaultDriver) {
        qWarning("QUnifiedTimer: animation driver already installed...");
        return;
    }

    bool running = driver->isRunning();
    if (running)
        stopAnimationDriver();
    driver = d;
    if (driver)
        allowNegativeDelta = driver->property("allowNegativeDelta").toBool();
    if (running)
        startAnimationDriver();
}